

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O2

int checkerBig1(void)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  FILE *__stream;
  char *__s;
  bool bVar3;
  int job;
  int check_cnt;
  
  _job = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar2 = 0xffffffff;
  }
  else {
    __s = ScanInt((FILE *)__stream,&check_cnt);
    if (check_cnt == 2000) {
      iVar1 = 2000;
      do {
        if (iVar1 == 0) goto LAB_00102977;
        __s = ScanInt((FILE *)__stream,&job);
        if (__s == "FAILED") goto LAB_00102974;
        bVar3 = iVar1 == job;
        iVar1 = iVar1 + -1;
      } while (bVar3);
      printf("wrong output -- ");
LAB_00102974:
      __s = "FAILED";
    }
    else {
      printf("wrong output -- ");
      __s = "FAILED";
    }
LAB_00102977:
    if (__s == "PASSED") {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar1 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar2 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");

    const char *fact = Pass;

    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }

    { // test order
        int N = N_MAX, check_cnt;
        fact = ScanInt(out, &check_cnt);

        if (check_cnt != N)
        {
            printf("wrong output -- ");
            fact = Fail;
        }
        else
        {
            for (int i = N; i > 0; i--) {

                int job;
                fact = ScanInt(out, &job);

                if (fact == Fail)
                    break;

                if (job != i) {
                    printf("wrong output -- ");
                    fact = Fail;
                    break;
                }
            }
        }
    }

    if (fact == Pass && HaveGarbageAtTheEnd(out))
        fact = Fail;

    fclose(out);
    
    printf("%s\n", fact);

    testN++;

    return fact == Fail;
}